

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_x_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  char cVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  int iVar28;
  undefined1 (*pauVar29) [16];
  int iVar30;
  uint16_t *puVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar46;
  int iVar47;
  short sVar53;
  int iVar54;
  int iVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar57;
  undefined1 auVar50 [16];
  short sVar52;
  short sVar55;
  undefined1 auVar51 [16];
  int iVar58;
  int iVar62;
  short sVar63;
  int iVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar67;
  undefined1 auVar61 [16];
  short sVar68;
  undefined1 auVar69 [16];
  short local_48;
  short sStack_46;
  
  iVar28 = conv_params->round_0 + conv_params->round_1;
  cVar14 = (char)bd - (char)iVar28;
  uVar21 = 0xe - iVar28;
  iVar28 = 7 - conv_params->round_1;
  iVar30 = (1 << (cVar14 + 0xdU & 0x1f)) + (1 << (cVar14 + 0xeU & 0x1f));
  uVar24 = 0xff;
  if (bd == 0xc) {
    uVar24 = 0xfff;
  }
  uVar34 = 0x3ff;
  if (bd != 10) {
    uVar34 = uVar24;
  }
  piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
  uVar15 = *(undefined4 *)piVar1;
  uVar16 = *(undefined4 *)(piVar1 + 2);
  uVar17 = *(undefined4 *)(piVar1 + 4);
  uVar18 = *(undefined4 *)(piVar1 + 6);
  pauVar29 = (undefined1 (*) [16])conv_params->dst;
  iVar2 = conv_params->dst_stride;
  iVar32 = ((1 << ((byte)uVar21 & 0x1f)) >> 1) - iVar30;
  iVar3 = conv_params->do_average;
  iVar4 = conv_params->fwd_offset;
  iVar39 = conv_params->bck_offset;
  auVar36 = ZEXT416((uint)conv_params->round_0);
  iVar5 = conv_params->use_dist_wtd_comp_avg;
  auVar38._4_4_ = iVar39;
  auVar38._0_4_ = iVar39;
  auVar38._8_4_ = iVar39;
  auVar38._12_4_ = iVar39;
  iVar39 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  auVar40 = pshuflw(ZEXT416(uVar34),ZEXT416(uVar34),0);
  auVar43._4_4_ = uVar15;
  auVar43._0_4_ = uVar15;
  auVar43._8_4_ = uVar15;
  auVar43._12_4_ = uVar15;
  uVar23 = (ulong)(uint)h;
  if (h < 1) {
    uVar23 = 0;
  }
  pauVar27 = (undefined1 (*) [16])((long)src + (0x12 - (ulong)(filter_params_x->taps & 0xfffffffe)))
  ;
  uVar33 = 0;
  while ((long)uVar33 < (long)w) {
    pauVar22 = pauVar29;
    pauVar25 = pauVar27;
    uVar26 = uVar23;
    puVar31 = dst0;
    while (bVar35 = uVar26 != 0, uVar26 = uVar26 - 1, bVar35) {
      auVar37 = pauVar25[-1];
      auVar42 = *pauVar25;
      auVar6._16_16_ = auVar42;
      auVar6._0_16_ = auVar37;
      auVar7._16_16_ = auVar42;
      auVar7._0_16_ = auVar37;
      auVar8._16_16_ = auVar42;
      auVar8._0_16_ = auVar37;
      auVar41._4_4_ = uVar17;
      auVar41._0_4_ = uVar17;
      auVar41._8_4_ = uVar17;
      auVar41._12_4_ = uVar17;
      auVar41 = pmaddwd(auVar7._8_16_,auVar41);
      auVar44._4_4_ = uVar18;
      auVar44._0_4_ = uVar18;
      auVar44._8_4_ = uVar18;
      auVar44._12_4_ = uVar18;
      auVar69 = pmaddwd(auVar8._12_16_,auVar44);
      auVar9._16_16_ = auVar42;
      auVar9._0_16_ = auVar37;
      auVar10._16_16_ = auVar42;
      auVar10._0_16_ = auVar37;
      auVar11._16_16_ = auVar42;
      auVar11._0_16_ = auVar37;
      auVar12._16_16_ = auVar42;
      auVar12._0_16_ = auVar37;
      auVar48 = pmaddwd(auVar37,auVar43);
      auVar37._4_4_ = uVar16;
      auVar37._0_4_ = uVar16;
      auVar37._8_4_ = uVar16;
      auVar37._12_4_ = uVar16;
      auVar44 = pmaddwd(auVar6._4_16_,auVar37);
      auVar49._4_4_ =
           auVar48._4_4_ + iVar39 + auVar44._4_4_ + auVar69._4_4_ + auVar41._4_4_ >> auVar36;
      auVar49._8_4_ =
           auVar48._8_4_ + iVar39 + auVar44._8_4_ + auVar69._8_4_ + auVar41._8_4_ >> auVar36;
      auVar49._12_4_ =
           auVar48._12_4_ + iVar39 + auVar44._12_4_ + auVar69._12_4_ + auVar41._12_4_ >> auVar36;
      auVar59 = pmaddwd(auVar9._2_16_,auVar43);
      auVar42._4_4_ = uVar16;
      auVar42._0_4_ = uVar16;
      auVar42._8_4_ = uVar16;
      auVar42._12_4_ = uVar16;
      auVar42 = pmaddwd(auVar10._6_16_,auVar42);
      auVar45._4_4_ = uVar17;
      auVar45._0_4_ = uVar17;
      auVar45._8_4_ = uVar17;
      auVar45._12_4_ = uVar17;
      auVar45 = pmaddwd(auVar11._10_16_,auVar45);
      auVar13._4_4_ = uVar18;
      auVar13._0_4_ = uVar18;
      auVar13._8_4_ = uVar18;
      auVar13._12_4_ = uVar18;
      auVar37 = pmaddwd(auVar12._14_16_,auVar13);
      auVar60._4_4_ =
           auVar59._4_4_ + iVar39 + auVar45._4_4_ + auVar42._4_4_ + auVar37._4_4_ >> auVar36;
      auVar60._8_4_ =
           auVar59._8_4_ + iVar39 + auVar45._8_4_ + auVar42._8_4_ + auVar37._8_4_ >> auVar36;
      auVar60._12_4_ =
           auVar59._12_4_ + iVar39 + auVar45._12_4_ + auVar42._12_4_ + auVar37._12_4_ >> auVar36;
      auVar49._0_4_ =
           (auVar48._0_4_ + iVar39 + auVar44._0_4_ + auVar69._0_4_ + auVar41._0_4_ >> auVar36) <<
           iVar28;
      auVar60._0_4_ =
           (auVar59._0_4_ + iVar39 + auVar45._0_4_ + auVar42._0_4_ + auVar37._0_4_ >> auVar36) <<
           iVar28;
      auVar48._0_4_ = auVar49._0_4_ + iVar30;
      auVar48._4_4_ = auVar60._0_4_ + iVar30;
      auVar48._8_4_ = auVar49._4_4_ + iVar30;
      auVar48._12_4_ = auVar60._4_4_ + iVar30;
      auVar37 = pmulld(auVar48,auVar38);
      auVar42 = ZEXT416(uVar21);
      local_48 = auVar40._0_2_;
      sStack_46 = auVar40._2_2_;
      if ((long)w + -8 < (long)uVar33) {
        if (iVar3 == 0) {
          auVar37 = packusdw(auVar48,auVar48);
          *(long *)*pauVar22 = auVar37._0_8_;
        }
        else {
          auVar41 = pmovzxwd(auVar49,*(undefined8 *)*pauVar22);
          if (iVar5 == 0) {
            iVar47 = auVar48._0_4_ + auVar41._0_4_ >> 1;
            iVar54 = auVar48._4_4_ + auVar41._4_4_ >> 1;
            iVar56 = auVar48._8_4_ + auVar41._8_4_ >> 1;
            iVar57 = auVar48._12_4_ + auVar41._12_4_ >> 1;
          }
          else {
            auVar19._4_4_ = iVar4;
            auVar19._0_4_ = iVar4;
            auVar19._8_4_ = iVar4;
            auVar19._12_4_ = iVar4;
            auVar41 = pmulld(auVar41,auVar19);
            iVar47 = auVar41._0_4_ + auVar37._0_4_ >> 4;
            iVar54 = auVar41._4_4_ + auVar37._4_4_ >> 4;
            iVar56 = auVar41._8_4_ + auVar37._8_4_ >> 4;
            iVar57 = auVar41._12_4_ + auVar37._12_4_ >> 4;
          }
          auVar50._0_4_ = iVar47 + iVar32 >> auVar42;
          auVar50._4_4_ = iVar54 + iVar32 >> auVar42;
          auVar50._8_4_ = iVar56 + iVar32 >> auVar42;
          auVar50._12_4_ = iVar57 + iVar32 >> auVar42;
          auVar37 = packusdw(auVar50,auVar50);
          sVar46 = auVar37._0_2_;
          sVar52 = auVar37._2_2_;
          sVar53 = auVar37._4_2_;
          sVar55 = auVar37._6_2_;
          *(ulong *)puVar31 =
               CONCAT26((ushort)(sStack_46 < sVar55) * sStack_46 |
                        (ushort)(sStack_46 >= sVar55) * sVar55,
                        CONCAT24((ushort)(local_48 < sVar53) * local_48 |
                                 (ushort)(local_48 >= sVar53) * sVar53,
                                 CONCAT22((ushort)(sStack_46 < sVar52) * sStack_46 |
                                          (ushort)(sStack_46 >= sVar52) * sVar52,
                                          (ushort)(local_48 < sVar46) * local_48 |
                                          (ushort)(local_48 >= sVar46) * sVar46)));
        }
      }
      else {
        auVar59._0_4_ = auVar49._8_4_ + iVar30;
        auVar59._4_4_ = auVar60._8_4_ + iVar30;
        auVar59._8_4_ = auVar49._12_4_ + iVar30;
        auVar59._12_4_ = auVar60._12_4_ + iVar30;
        if (iVar3 == 0) {
          auVar37 = packusdw(auVar48,auVar59);
          *pauVar22 = auVar37;
        }
        else {
          auVar41 = *pauVar22;
          auVar45 = pmovzxwd(auVar60,auVar41);
          auVar69._0_4_ = CONCAT22(0,auVar41._8_2_);
          auVar69._4_2_ = auVar41._10_2_;
          auVar69._6_2_ = 0;
          auVar69._8_2_ = auVar41._12_2_;
          auVar69._10_2_ = 0;
          auVar69._12_2_ = auVar41._14_2_;
          auVar69._14_2_ = 0;
          if (iVar5 == 0) {
            iVar58 = auVar48._0_4_ + auVar45._0_4_ >> 1;
            iVar62 = auVar48._4_4_ + auVar45._4_4_ >> 1;
            iVar64 = auVar48._8_4_ + auVar45._8_4_ >> 1;
            iVar67 = auVar48._12_4_ + auVar45._12_4_ >> 1;
            iVar47 = (int)(auVar59._0_4_ + auVar69._0_4_) >> 1;
            iVar54 = (int)(auVar59._4_4_ + (uint)auVar41._10_2_) >> 1;
            iVar56 = (int)(auVar59._8_4_ + (uint)auVar41._12_2_) >> 1;
            iVar57 = (int)(auVar59._12_4_ + (uint)auVar41._14_2_) >> 1;
          }
          else {
            auVar20._4_4_ = iVar4;
            auVar20._0_4_ = iVar4;
            auVar20._8_4_ = iVar4;
            auVar20._12_4_ = iVar4;
            auVar41 = pmulld(auVar45,auVar20);
            iVar58 = auVar41._0_4_ + auVar37._0_4_ >> 4;
            iVar62 = auVar41._4_4_ + auVar37._4_4_ >> 4;
            iVar64 = auVar41._8_4_ + auVar37._8_4_ >> 4;
            iVar67 = auVar41._12_4_ + auVar37._12_4_ >> 4;
            auVar37 = pmulld(auVar69,auVar20);
            auVar41 = pmulld(auVar59,auVar38);
            iVar47 = auVar41._0_4_ + auVar37._0_4_ >> 4;
            iVar54 = auVar41._4_4_ + auVar37._4_4_ >> 4;
            iVar56 = auVar41._8_4_ + auVar37._8_4_ >> 4;
            iVar57 = auVar41._12_4_ + auVar37._12_4_ >> 4;
          }
          auVar61._0_4_ = iVar58 + iVar32 >> auVar42;
          auVar61._4_4_ = iVar62 + iVar32 >> auVar42;
          auVar61._8_4_ = iVar64 + iVar32 >> auVar42;
          auVar61._12_4_ = iVar67 + iVar32 >> auVar42;
          auVar51._0_4_ = iVar47 + iVar32 >> auVar42;
          auVar51._4_4_ = iVar54 + iVar32 >> auVar42;
          auVar51._8_4_ = iVar56 + iVar32 >> auVar42;
          auVar51._12_4_ = iVar57 + iVar32 >> auVar42;
          auVar37 = packusdw(auVar61,auVar51);
          sVar46 = auVar37._0_2_;
          sVar52 = auVar37._2_2_;
          sVar53 = auVar37._4_2_;
          sVar55 = auVar37._6_2_;
          sVar63 = auVar37._8_2_;
          sVar65 = auVar37._10_2_;
          sVar66 = auVar37._12_2_;
          sVar68 = auVar37._14_2_;
          *puVar31 = (ushort)(local_48 < sVar46) * local_48 | (ushort)(local_48 >= sVar46) * sVar46;
          puVar31[1] = (ushort)(sStack_46 < sVar52) * sStack_46 |
                       (ushort)(sStack_46 >= sVar52) * sVar52;
          puVar31[2] = (ushort)(local_48 < sVar53) * local_48 |
                       (ushort)(local_48 >= sVar53) * sVar53;
          puVar31[3] = (ushort)(sStack_46 < sVar55) * sStack_46 |
                       (ushort)(sStack_46 >= sVar55) * sVar55;
          puVar31[4] = (ushort)(local_48 < sVar63) * local_48 |
                       (ushort)(local_48 >= sVar63) * sVar63;
          puVar31[5] = (ushort)(sStack_46 < sVar65) * sStack_46 |
                       (ushort)(sStack_46 >= sVar65) * sVar65;
          puVar31[6] = (ushort)(local_48 < sVar66) * local_48 |
                       (ushort)(local_48 >= sVar66) * sVar66;
          puVar31[7] = (ushort)(sStack_46 < sVar68) * sStack_46 |
                       (ushort)(sStack_46 >= sVar68) * sVar68;
        }
      }
      pauVar25 = (undefined1 (*) [16])(*pauVar25 + (long)src_stride * 2);
      pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)iVar2 * 2);
      puVar31 = puVar31 + dst_stride0;
    }
    pauVar27 = pauVar27 + 1;
    pauVar29 = pauVar29 + 1;
    dst0 = dst0 + 8;
    uVar33 = uVar33 + 8;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m128i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 1) {
      const __m128i row00 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
      const __m128i row01 =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

      // even pixels
      s[0] = _mm_alignr_epi8(row01, row00, 0);
      s[1] = _mm_alignr_epi8(row01, row00, 4);
      s[2] = _mm_alignr_epi8(row01, row00, 8);
      s[3] = _mm_alignr_epi8(row01, row00, 12);

      __m128i res_even = convolve(s, coeffs_x);
      res_even =
          _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x), round_shift_x);

      // odd pixels
      s[0] = _mm_alignr_epi8(row01, row00, 2);
      s[1] = _mm_alignr_epi8(row01, row00, 6);
      s[2] = _mm_alignr_epi8(row01, row00, 10);
      s[3] = _mm_alignr_epi8(row01, row00, 14);

      __m128i res_odd = convolve(s, coeffs_x);
      res_odd =
          _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x), round_shift_x);

      res_even = _mm_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm_sll_epi32(res_odd, round_shift_bits);

      __m128i res1 = _mm_unpacklo_epi32(res_even, res_odd);
      __m128i res_unsigned_lo = _mm_add_epi32(res1, offset_const);
      if (w - j < 8) {
        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);

          const __m128i comp_avg_res = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i round_result = highbd_convolve_rounding_sse2(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b = _mm_packus_epi32(round_result, round_result);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b);
        }
      } else {
        __m128i res2 = _mm_unpackhi_epi32(res_even, res_odd);
        __m128i res_unsigned_hi = _mm_add_epi32(res2, offset_const);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          __m128i res_16b = _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
        }
      }
    }
  }
}